

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.hpp
# Opt level: O1

void CorUnix::CPalSynchronizationManager::ReleaseLocalSynchLock(CPalThread *pthrCurrent)

{
  if ((pthrCurrent->synchronizationInfo).m_lLocalSynchLockCount.m_val < 1) {
    fprintf(_stderr,"] %s %s:%d","ReleaseLocalSynchLock",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.hpp"
            ,0x277);
    fprintf(_stderr,"Expression: 0 < pthrCurrent->synchronizationInfo.m_lLocalSynchLockCount\n");
  }
  (pthrCurrent->synchronizationInfo).m_lLocalSynchLockCount.m_val =
       (pthrCurrent->synchronizationInfo).m_lLocalSynchLockCount.m_val + -1;
  if ((pthrCurrent->synchronizationInfo).m_lLocalSynchLockCount.m_val != 0) {
    return;
  }
  InternalLeaveCriticalSection(pthrCurrent,(PCRITICAL_SECTION)s_csSynchProcessLock);
  CThreadSynchronizationInfo::RunDeferredThreadConditionSignalings
            (&pthrCurrent->synchronizationInfo);
  return;
}

Assistant:

static void ReleaseLocalSynchLock(CPalThread * pthrCurrent) 
        {
            _ASSERTE(0 < pthrCurrent->synchronizationInfo.m_lLocalSynchLockCount);
            if (0 == --pthrCurrent->synchronizationInfo.m_lLocalSynchLockCount)
            {
                InternalLeaveCriticalSection(pthrCurrent, &s_csSynchProcessLock);
                
#if SYNCHMGR_SUSPENSION_SAFE_CONDITION_SIGNALING && !SYNCHMGR_PIPE_BASED_THREAD_BLOCKING
                pthrCurrent->synchronizationInfo.RunDeferredThreadConditionSignalings();
#endif // SYNCHMGR_SUSPENSION_SAFE_CONDITION_SIGNALING && !SYNCHMGR_PIPE_BASED_THREAD_BLOCKING
            }
        }